

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void av1_fwd_txfm2d_8x8_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte in_CL;
  int width_div8;
  int width;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  TX_SIZE tx_size;
  __m256i out [8];
  __m256i in [8];
  int in_stack_00000274;
  int in_stack_00000278;
  int8_t in_stack_0000027f;
  __m256i *in_stack_00000280;
  __m256i *in_stack_00000288;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  int32_t *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 uVar4;
  int iVar5;
  int col_num;
  int shift_00;
  int8_t iVar6;
  __m256i *in_00;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  __m256i *in_stack_fffffffffffffdf8;
  int16_t *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  __m256i *in_stack_fffffffffffffea8;
  __m256i *in_stack_fffffffffffffeb0;
  
  uVar4 = 1;
  in_00 = (__m256i *)av1_fwd_txfm_shift_ls[1];
  iVar1 = get_txw_idx('\x01');
  iVar2 = get_txh_idx((TX_SIZE)uVar4);
  shift_00 = 8;
  col_num = 1;
  uVar3 = (ulong)in_CL;
  switch(uVar3) {
  case 0:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 1:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 2:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 3:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 4:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 5:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 6:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 7:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 8:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 9:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    iVar5 = (int)(uVar3 >> 0x20);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),(int8_t)((uint)shift_00 >> 0x18),col_num,iVar5
              );
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    iVar6 = (int8_t)((uint)shift_00 >> 0x18);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),iVar6,col_num,iVar5);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 10:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    iVar5 = (int)(uVar3 >> 0x20);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    iVar6 = (int8_t)((uint)shift_00 >> 0x18);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),iVar6,col_num,iVar5);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 0xb:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),(int8_t)((uint)shift_00 >> 0x18),col_num,
               (int)(uVar3 >> 0x20));
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fdct8_avx2((__m256i *)out[5][1],(__m256i *)out[5][0],out[4][3]._7_1_,(int)out[4][3],
               out[4][2]._4_4_);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 0xc:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    iVar5 = (int)(uVar3 >> 0x20);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    iVar6 = (int8_t)((uint)shift_00 >> 0x18);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),iVar6,col_num,iVar5);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 0xd:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),(int8_t)((uint)shift_00 >> 0x18),col_num,
               (int)(uVar3 >> 0x20));
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 0xe:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    iVar5 = (int)(uVar3 >> 0x20);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    iVar6 = (int8_t)((uint)shift_00 >> 0x18);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),iVar6,col_num,iVar5);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    break;
  case 0xf:
    load_buffer_8x8_avx2
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
    idtx8_avx2(in_00,(__m256i *)CONCAT44(iVar1,iVar2),(int8_t)((uint)shift_00 >> 0x18),col_num,
               (int)(uVar3 >> 0x20));
    col_txfm_8x8_rounding((__m256i *)CONCAT44(iVar1,iVar2),shift_00);
    fwd_txfm_transpose_8x8_avx2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
               in_stack_fffffffffffffea0);
    fadst8_avx2(in_stack_00000288,in_stack_00000280,in_stack_0000027f,in_stack_00000278,
                in_stack_00000274);
    store_buffer_avx2((__m256i *)CONCAT44(uVar4,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
                      ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_avx2(const int16_t *input, int32_t *coeff, int stride,
                             TX_TYPE tx_type, int bd) {
  __m256i in[8], out[8];
  const TX_SIZE tx_size = TX_8X8;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int width = tx_size_wide[tx_size];
  const int width_div8 = (width >> 3);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case DCT_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 1, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case IDTX:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    default: assert(0);
  }
  (void)bd;
}